

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

int Wlc_NtkMemAbstract(Wlc_Ntk_t *p,int nIterMax,int fDumpAbs,int fPdrVerbose,int fVerbose)

{
  int iVar1;
  Vec_Int_t *vVec1;
  abctime aVar2;
  uint local_190;
  char *pFileName;
  Pdr_Par_t *pPdrPars;
  Pdr_Par_t PdrPars;
  int nIters;
  int nDcBits;
  int iFirstMemCi;
  int iFirstCi;
  int iFirstMemPi;
  int RetValue;
  Vec_Int_t *vRefine;
  Vec_Int_t *vFirstTotal;
  Vec_Int_t *vMemFanins;
  Vec_Int_t *vMemObjs;
  Vec_Int_t *vNodeFrames;
  Vec_Wec_t *vRefines;
  Vec_Wrd_t *vValues;
  Abc_Cex_t *pCex;
  Gia_Man_t *pAbs;
  Gia_Man_t *pAbsFull;
  Aig_Man_t *pTempAig;
  Aig_Man_t *pAig;
  Wlc_Ntk_t *pNew;
  Wlc_Ntk_t *pNewFull;
  abctime clk;
  int fVerbose_local;
  int fPdrVerbose_local;
  int fDumpAbs_local;
  int nIterMax_local;
  Wlc_Ntk_t *p_local;
  
  clk._0_4_ = fVerbose;
  clk._4_4_ = fPdrVerbose;
  fVerbose_local = fDumpAbs;
  fPdrVerbose_local = nIterMax;
  _fDumpAbs_local = p;
  pNewFull = (Wlc_Ntk_t *)Abc_Clock();
  vValues = (Vec_Wrd_t *)0x0;
  vRefines = (Vec_Wec_t *)0x0;
  vNodeFrames = (Vec_Int_t *)Vec_WecAlloc(100);
  vMemObjs = Vec_IntAlloc(100);
  iFirstCi = -1;
  vMemFanins = Wlc_NtkCollectMemory(_fDumpAbs_local,0);
  vFirstTotal = Wlc_NtkCollectMemFanins(_fDumpAbs_local,vMemFanins);
  pNew = Wlc_NtkAbstractMemory
                   (_fDumpAbs_local,vMemFanins,vFirstTotal,&iFirstMemCi,&nDcBits,&nIters,
                    (Vec_Wec_t *)0x0,(Vec_Int_t *)0x0);
  PdrPars.pInvFileName._4_4_ = Wlc_CountDcs(pNew->pInits);
  vRefine = Wlc_NtkDeriveFirstTotal
                      (_fDumpAbs_local,vMemFanins,vFirstTotal,iFirstMemCi,
                       PdrPars.pInvFileName._4_4_ + nIters,(int)clk);
  pAbs = Wlc_NtkBitBlast(pNew,(Wlc_BstPar_t *)0x0);
  iVar1 = Gia_ManPiNum(pAbs);
  if (iVar1 != nDcBits + PdrPars.pInvFileName._4_4_) {
    __assert_fail("Gia_ManPiNum(pAbsFull) == iFirstCi + nDcBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                  ,0x3ec,"int Wlc_NtkMemAbstract(Wlc_Ntk_t *, int, int, int, int)");
  }
  Wlc_NtkFree(pNew);
  PdrPars.pInvFileName._0_4_ = 0;
  do {
    if (fPdrVerbose_local <= (int)(uint)PdrPars.pInvFileName) {
LAB_003f559e:
      Gia_ManStop(pAbs);
      Vec_WecFree((Vec_Wec_t *)vNodeFrames);
      Vec_IntFreeP(&vMemFanins);
      Vec_IntFreeP(&vFirstTotal);
      Vec_IntFreeP(&vRefine);
      Vec_IntFreeP(&vMemObjs);
      if ((int)clk != 0) {
        printf("\n");
      }
      printf("Abstraction ");
      if ((iFirstCi == 0) && (vValues != (Vec_Wrd_t *)0x0)) {
        printf("resulted in a real CEX in frame %d",(ulong)(uint)vValues->nSize);
      }
      else if (iFirstCi == 1) {
        printf("is successfully proved");
      }
      else {
        printf("timed out");
      }
      printf(" after %d iterations. ",(ulong)(uint)PdrPars.pInvFileName);
      aVar2 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar2 - (long)pNewFull);
      Abc_CexFreeP((Abc_Cex_t **)&vValues);
      return iFirstCi;
    }
    Pdr_ManSetDefaultParams((Pdr_Par_t *)&pPdrPars);
    PdrPars.fSkipDown = 0;
    PdrPars.fUseAbs = (int)clk;
    pAig = (Aig_Man_t *)
           Wlc_NtkAbstractMemory
                     (_fDumpAbs_local,vMemFanins,(Vec_Int_t *)0x0,&iFirstMemCi,&nDcBits,&nIters,
                      (Vec_Wec_t *)vNodeFrames,vMemObjs);
    pCex = (Abc_Cex_t *)Wlc_NtkBitBlast((Wlc_Ntk_t *)pAig,(Wlc_BstPar_t *)0x0);
    pTempAig = Gia_ManToAigSimple((Gia_Man_t *)pCex);
    Gia_ManStop((Gia_Man_t *)pCex);
    pTempAig->nConstrs = 1;
    pAbsFull = (Gia_Man_t *)pTempAig;
    pTempAig = Saig_ManDupFoldConstrsFunc(pTempAig,0,0);
    Aig_ManStop((Aig_Man_t *)pAbsFull);
    pCex = (Abc_Cex_t *)Gia_ManFromAigSimple(pTempAig);
    Aig_ManStop(pTempAig);
    pTempAig = Gia_ManToAigSimple((Gia_Man_t *)pCex);
    iFirstCi = Pdr_ManSolve(pTempAig,(Pdr_Par_t *)&pPdrPars);
    vValues = (Vec_Wrd_t *)pTempAig->pSeqModel;
    pTempAig->pSeqModel = (Abc_Cex_t *)0x0;
    Aig_ManStop(pTempAig);
    if ((int)clk != 0) {
      printf("\nITERATIONS %d:\n",(ulong)(uint)PdrPars.pInvFileName);
    }
    if ((int)clk != 0) {
      Wlc_NtkPrintCex(_fDumpAbs_local,(Wlc_Ntk_t *)pAig,(Abc_Cex_t *)vValues);
    }
    Wlc_NtkFree((Wlc_Ntk_t *)pAig);
    if (fVerbose_local != 0) {
      Gia_AigerWrite((Gia_Man_t *)pCex,"mem_abs.aig",0,0,0);
      if (vValues == (Vec_Wrd_t *)0x0) {
        local_190 = 0xffffffff;
      }
      else {
        local_190 = vValues->nSize;
      }
      printf("Iteration %3d: Dumped abstraction in file \"%s\" after finding CEX in frame %d.\n",
             (ulong)(uint)PdrPars.pInvFileName,"mem_abs.aig",(ulong)local_190);
    }
    if (vValues == (Vec_Wrd_t *)0x0) {
      if (iFirstCi == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                      ,0x41e,"int Wlc_NtkMemAbstract(Wlc_Ntk_t *, int, int, int, int)");
      }
      Gia_ManStop((Gia_Man_t *)pCex);
      goto LAB_003f559e;
    }
    vRefines = (Vec_Wec_t *)Wlc_NtkConvertCex(vRefine,pAbs,(Abc_Cex_t *)vValues,(int)clk);
    Gia_ManStop((Gia_Man_t *)pCex);
    _iFirstMemPi = Wlc_NtkFindConflict(_fDumpAbs_local,vMemFanins,(Vec_Wrd_t *)vRefines,
                                       vValues->nSize + 1);
    Vec_WrdFree((Vec_Wrd_t *)vRefines);
    if (_iFirstMemPi == (Vec_Int_t *)0x0) goto LAB_003f559e;
    Abc_CexFreeP((Abc_Cex_t **)&vValues);
    if ((int)clk != 0) {
      Wlc_NtkPrintConflict(_fDumpAbs_local,_iFirstMemPi);
    }
    Vec_WecPushLevel((Vec_Wec_t *)vNodeFrames);
    vVec1 = Vec_WecEntryLast((Vec_Wec_t *)vNodeFrames);
    Vec_IntAppend(vVec1,_iFirstMemPi);
    Wlc_NtkAbsAddToNodeFrames(vMemObjs,_iFirstMemPi);
    Vec_IntFree(_iFirstMemPi);
    PdrPars.pInvFileName._0_4_ = (uint)PdrPars.pInvFileName + 1;
  } while( true );
}

Assistant:

int Wlc_NtkMemAbstract( Wlc_Ntk_t * p, int nIterMax, int fDumpAbs, int fPdrVerbose, int fVerbose )
{
    abctime clk = Abc_Clock();
    Wlc_Ntk_t * pNewFull, * pNew; Aig_Man_t * pAig, * pTempAig;
    Gia_Man_t * pAbsFull, * pAbs;
    Abc_Cex_t * pCex = NULL;  Vec_Wrd_t * vValues = NULL; 
    Vec_Wec_t * vRefines = Vec_WecAlloc( 100 );
    Vec_Int_t * vNodeFrames = Vec_IntAlloc( 100 );
    Vec_Int_t * vMemObjs, * vMemFanins, * vFirstTotal, * vRefine; 
    int RetValue = -1, iFirstMemPi, iFirstCi, iFirstMemCi, nDcBits, nIters;

    vMemObjs    = Wlc_NtkCollectMemory( p, 0 );
    vMemFanins  = Wlc_NtkCollectMemFanins( p, vMemObjs );
    pNewFull    = Wlc_NtkAbstractMemory( p, vMemObjs, vMemFanins, &iFirstMemPi, &iFirstCi, &iFirstMemCi, NULL, NULL );
    nDcBits     = Wlc_CountDcs( pNewFull->pInits );
    vFirstTotal = Wlc_NtkDeriveFirstTotal( p, vMemObjs, vMemFanins, iFirstMemPi, nDcBits + iFirstMemCi, fVerbose );

    pAbsFull    = Wlc_NtkBitBlast( pNewFull, NULL );
    assert( Gia_ManPiNum(pAbsFull) == iFirstCi + nDcBits );
    Wlc_NtkFree( pNewFull );

    // perform abstraction
    for ( nIters = 0; nIters < nIterMax; nIters++ )
    {
        // set up parameters to run PDR
        Pdr_Par_t PdrPars, * pPdrPars = &PdrPars;
        Pdr_ManSetDefaultParams( pPdrPars );
        pPdrPars->fUseAbs    = 0;   // use 'pdr -t'  (on-the-fly abstraction)
        pPdrPars->fVerbose   = fVerbose;

        // derive specific abstraction
        pNew = Wlc_NtkAbstractMemory( p, vMemObjs, NULL, &iFirstMemPi, &iFirstCi, &iFirstMemCi, vRefines, vNodeFrames );
        pAbs = Wlc_NtkBitBlast( pNew, NULL );
        // simplify the AIG
        //pAbs = Gia_ManSeqStructSweep( pGiaTemp = pAbs, 1, 1, 0 );
        //Gia_ManStop( pGiaTemp );

        // roll in the constraints
        pAig = Gia_ManToAigSimple( pAbs );
        Gia_ManStop( pAbs );
        pAig->nConstrs = 1;
        pAig = Saig_ManDupFoldConstrsFunc( pTempAig = pAig, 0, 0 );
        Aig_ManStop( pTempAig );
        pAbs = Gia_ManFromAigSimple( pAig );
        Aig_ManStop( pAig );

        // try to prove abstracted GIA by converting it to AIG and calling PDR
        pAig = Gia_ManToAigSimple( pAbs );
        RetValue = Pdr_ManSolve( pAig, pPdrPars );
        pCex = pAig->pSeqModel; pAig->pSeqModel = NULL;
        Aig_ManStop( pAig );

        if ( fVerbose )
            printf( "\nITERATIONS %d:\n", nIters );
        if ( fVerbose )
            Wlc_NtkPrintCex( p, pNew, pCex );
        Wlc_NtkFree( pNew );

        if ( fDumpAbs )
        {
            char * pFileName = "mem_abs.aig";
            Gia_AigerWrite( pAbs, pFileName, 0, 0, 0 );
            printf( "Iteration %3d: Dumped abstraction in file \"%s\" after finding CEX in frame %d.\n", nIters, pFileName, pCex ? pCex->iFrame : -1 );
        }

        // check if proved or undecided
        if ( pCex == NULL ) 
        {
            assert( RetValue );
            Gia_ManStop( pAbs );
            break;
        }

        // analyze counter-example
        vValues = Wlc_NtkConvertCex( vFirstTotal, pAbsFull, pCex, fVerbose );
        Gia_ManStop( pAbs );
        vRefine = Wlc_NtkFindConflict( p, vMemObjs, vValues, pCex->iFrame + 1 );
        Vec_WrdFree( vValues );
        if ( vRefine == NULL ) // cannot refine
            break;
        Abc_CexFreeP( &pCex );

        // save refinement for the future
        if ( fVerbose )
            Wlc_NtkPrintConflict( p, vRefine );
        Vec_WecPushLevel( vRefines );
        Vec_IntAppend( Vec_WecEntryLast(vRefines), vRefine );
        Wlc_NtkAbsAddToNodeFrames( vNodeFrames, vRefine );
        Vec_IntFree( vRefine );
    }
    // cleanup
    Gia_ManStop( pAbsFull );
    Vec_WecFree( vRefines );
    Vec_IntFreeP( &vMemObjs );
    Vec_IntFreeP( &vMemFanins );
    Vec_IntFreeP( &vFirstTotal );
    Vec_IntFreeP( &vNodeFrames );

    // report the result
    if ( fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 && pCex )
        printf( "resulted in a real CEX in frame %d", pCex->iFrame );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", nIters );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Abc_CexFreeP( &pCex ); // return CEX in the future
    return RetValue;
}